

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O0

int64_t npas4::GetRAMSystemUsed(void)

{
  int64_t total;
  sysinfo memInfo;
  
  sysinfo((sysinfo *)&total);
  return ((memInfo._80_8_ - memInfo.totalhigh) +
         (memInfo.bufferram - memInfo.totalswap) + (memInfo.loads[2] - memInfo.totalram)) *
         (ulong)(uint)memInfo.freehigh;
}

Assistant:

int64_t npas4::GetRAMSystemUsed()
{
#ifdef WIN32
	return npas4::GetRAMSystemTotal() - npas4::GetRAMSystemAvailable();
#else
	struct sysinfo memInfo;
	sysinfo(&memInfo);
	int64_t total = memInfo.totalram - memInfo.freeram;
	total += memInfo.totalswap - memInfo.freeswap;
	total += memInfo.totalhigh - memInfo.freehigh;
	return total * static_cast<int64_t>(memInfo.mem_unit);
#endif
}